

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

void __thiscall kratos::StmtFileNameVisitor::visit(StmtFileNameVisitor *this,AssignStmt *stmt)

{
  map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *pmVar1;
  map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *this_00;
  mapped_type *pmVar2;
  map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *pmVar3;
  map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *pmVar4;
  AssignStmt *local_20;
  
  this_00 = this->stmt_fn_ln_;
  pmVar1 = this_00 + 8;
  pmVar3 = pmVar1;
  for (pmVar4 = *(map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                  **)(this_00 + 0x10);
      pmVar4 != (map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                 *)0x0;
      pmVar4 = *(map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                 **)(pmVar4 + (ulong)(*(AssignStmt **)(pmVar4 + 0x20) < stmt) * 8 + 0x10)) {
    if (*(AssignStmt **)(pmVar4 + 0x20) >= stmt) {
      pmVar3 = pmVar4;
    }
  }
  pmVar4 = pmVar1;
  if ((pmVar3 != pmVar1) && (pmVar4 = pmVar3, stmt < *(AssignStmt **)(pmVar3 + 0x20))) {
    pmVar4 = pmVar1;
  }
  if (pmVar4 != pmVar1) {
    local_20 = stmt;
    pmVar2 = std::
             map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
             ::at(this_00,(key_type *)&local_20);
    std::__cxx11::string::_M_assign((string *)&this->filename);
    this->ln = pmVar2->second;
  }
  return;
}

Assistant:

void visit(AssignStmt *stmt) override {
        if (stmt_fn_ln_.find(stmt) != stmt_fn_ln_.end()) {
            std::tie(filename, ln) = stmt_fn_ln_.at(stmt);
        }
    }